

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkTransferPhases(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  int iVar7;
  long lVar8;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xb54,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pVVar3 = pNtk->vObjs;
  if (pNtk->vPhases->nSize != pVVar3->nSize) {
    __assert_fail("Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xb55,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkNew->vPhases != (Vec_Int_t *)0x0) {
    __assert_fail("pNtkNew->vPhases == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xb56,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = pNtkNew->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  pNtkNew->vPhases = pVVar6;
  if (0 < pVVar3->nSize) {
    ppvVar4 = pVVar3->pArray;
    lVar8 = 0;
    do {
      if (((ppvVar4[lVar8] != (void *)0x0) &&
          (lVar5 = *(long *)((long)ppvVar4[lVar8] + 0x40), lVar5 != 0)) &&
         ((*(byte *)(lVar5 + 0x14) & 0xf) != 0)) {
        if (pNtk->vPhases->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = *(uint *)(lVar5 + 0x10);
        if (((int)uVar2 < 0) || (pVVar6->nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar2] = pNtk->vPhases->pArray[lVar8];
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTransferPhases( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->vPhases != NULL );
    assert( Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk) );
    assert( pNtkNew->vPhases == NULL );
    pNtkNew->vPhases = Vec_IntStart( Abc_NtkObjNumMax(pNtkNew) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy && !Abc_ObjIsNone( (Abc_Obj_t *)pObj->pCopy ) )
            Vec_IntWriteEntry( pNtkNew->vPhases, Abc_ObjId( (Abc_Obj_t *)pObj->pCopy ), Vec_IntEntry(pNtk->vPhases, i) );
}